

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jccolor.c
# Opt level: O3

void grayscale_convert(j_compress_ptr cinfo,JSAMPARRAY input_buf,JSAMPIMAGE output_buf,
                      JDIMENSION output_row,int num_rows)

{
  uint uVar1;
  int iVar2;
  JSAMPROW pJVar3;
  bool bVar4;
  JSAMPLE *pJVar5;
  ulong uVar6;
  
  if (0 < num_rows) {
    uVar1 = cinfo->image_width;
    iVar2 = cinfo->input_components;
    do {
      if ((ulong)uVar1 != 0) {
        pJVar3 = (*output_buf)[output_row];
        pJVar5 = *input_buf;
        uVar6 = 0;
        do {
          pJVar3[uVar6] = *pJVar5;
          pJVar5 = pJVar5 + iVar2;
          uVar6 = uVar6 + 1;
        } while (uVar1 != uVar6);
      }
      input_buf = input_buf + 1;
      output_row = output_row + 1;
      bVar4 = 1 < num_rows;
      num_rows = num_rows + -1;
    } while (bVar4);
  }
  return;
}

Assistant:

METHODDEF(void)
grayscale_convert (j_compress_ptr cinfo,
		   JSAMPARRAY input_buf, JSAMPIMAGE output_buf,
		   JDIMENSION output_row, int num_rows)
{
  register JSAMPROW inptr;
  register JSAMPROW outptr;
  register JDIMENSION col;
  JDIMENSION num_cols = cinfo->image_width;
  int instride = cinfo->input_components;

  while (--num_rows >= 0) {
    inptr = *input_buf++;
    outptr = output_buf[0][output_row];
    output_row++;
    for (col = 0; col < num_cols; col++) {
      outptr[col] = inptr[0];	/* don't need GETJSAMPLE() here */
      inptr += instride;
    }
  }
}